

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  u8 *puVar1;
  short sVar2;
  Table *pTVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  Expr *pEVar8;
  ExprList_item *pEVar9;
  Expr *pEVar10;
  RenameToken *pRVar11;
  Column *pCVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  Column *local_60;
  
  pTVar3 = pParse->pNewTable;
  if (pTVar3 == (Table *)0x0) goto LAB_0015c76f;
  if ((pTVar3->tabFlags & 4) != 0) {
    sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar3->zName);
    goto LAB_0015c76f;
  }
  uVar4 = pTVar3->tabFlags | 4;
  pTVar3->tabFlags = uVar4;
  if (pList == (ExprList *)0x0) {
    lVar14 = (long)pTVar3->nCol + -1;
    local_60 = pTVar3->aCol + lVar14;
    puVar1 = &pTVar3->aCol[lVar14].colFlags;
    *puVar1 = *puVar1 | 1;
    bVar16 = true;
  }
  else {
    iVar6 = pList->nExpr;
    if ((long)iVar6 < 1) {
      bVar16 = false;
      lVar14 = 0xffffffff;
      local_60 = (Column *)0x0;
    }
    else {
      lVar14 = 0xffffffff;
      lVar15 = 0;
      local_60 = (Column *)0x0;
      do {
        pEVar8 = pList->a[lVar15].pExpr;
        while ((pEVar8 != (Expr *)0x0 && ((pEVar8->flags >> 0xc & 1) != 0))) {
          if ((pEVar8->flags >> 0x12 & 1) == 0) {
            pEVar9 = (ExprList_item *)&pEVar8->pLeft;
          }
          else {
            pEVar9 = ((pEVar8->x).pList)->a;
          }
          pEVar8 = pEVar9->pExpr;
        }
        pEVar10 = pEVar8;
        if ((pEVar8->op == 'n') ||
           ((pEVar8->op == 'j' && (pEVar10 = pEVar8->pLeft, pEVar10->op == 'n')))) {
          pEVar10->op = ';';
        }
        if (pEVar8->op == ';') {
          sVar2 = pTVar3->nCol;
          if ((long)sVar2 < 1) {
            lVar14 = 0;
          }
          else {
            pcVar13 = (pEVar8->u).zToken;
            pCVar12 = pTVar3->aCol;
            lVar14 = 0;
            do {
              iVar5 = sqlite3StrICmp(pcVar13,pCVar12->zName);
              if (iVar5 == 0) {
                pCVar12->colFlags = pCVar12->colFlags | 1;
                local_60 = pCVar12;
                break;
              }
              lVar14 = lVar14 + 1;
              pCVar12 = pCVar12 + 1;
            } while (sVar2 != lVar14);
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar6);
      bVar16 = iVar6 == 1;
    }
  }
  if ((bVar16) && (local_60 != (Column *)0x0)) {
    if ((local_60->colFlags & 4) == 0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = local_60->zName;
      sVar7 = strlen(pcVar13);
      pcVar13 = pcVar13 + sVar7 + 1;
    }
    iVar6 = sqlite3StrICmp(pcVar13,"INTEGER");
    if ((sortOrder == 1) || (iVar6 != 0)) goto LAB_0015c6cd;
    if ((pList != (ExprList *)0x0) && (1 < pParse->eParseMode)) {
      pEVar8 = pList->a[0].pExpr;
      while ((pEVar8 != (Expr *)0x0 && ((pEVar8->flags >> 0xc & 1) != 0))) {
        if ((pEVar8->flags >> 0x12 & 1) == 0) {
          pEVar9 = (ExprList_item *)&pEVar8->pLeft;
        }
        else {
          pEVar9 = ((pEVar8->x).pList)->a;
        }
        pEVar8 = pEVar9->pExpr;
      }
      pRVar11 = pParse->pRename;
      if (pRVar11 != (RenameToken *)0x0) {
        do {
          if ((Expr *)pRVar11->p == pEVar8) {
            pRVar11->p = &pTVar3->iPKey;
            break;
          }
          pRVar11 = pRVar11->pNext;
        } while (pRVar11 != (RenameToken *)0x0);
      }
    }
    pTVar3->iPKey = (i16)lVar14;
    pTVar3->keyConf = (u8)onError;
    pTVar3->tabFlags = uVar4 | autoInc << 3;
    if (pList != (ExprList *)0x0) {
      pParse->iPkSortOrder = pList->a[0].sortOrder;
      goto LAB_0015c76f;
    }
  }
  else {
LAB_0015c6cd:
    if (autoInc != 0) {
      sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
      goto LAB_0015c76f;
    }
    sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,(Token *)0x0,
                       (Expr *)0x0,sortOrder,0,'\x02');
  }
  pList = (ExprList *)0x0;
LAB_0015c76f:
  if (pList == (ExprList *)0x0) {
    return;
  }
  exprListDeleteNN(pParse->db,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  Column *pCol = 0;
  int iCol = -1, i;
  int nTerm;
  if( pTab==0 ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse, 
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pCol = &pTab->aCol[iCol];
    pCol->colFlags |= COLFLAG_PRIMKEY;
    nTerm = 1;
  }else{
    nTerm = pList->nExpr;
    for(i=0; i<nTerm; i++){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[i].pExpr);
      assert( pCExpr!=0 );
      sqlite3StringToId(pCExpr);
      if( pCExpr->op==TK_ID ){
        const char *zCName = pCExpr->u.zToken;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          if( sqlite3StrICmp(zCName, pTab->aCol[iCol].zName)==0 ){
            pCol = &pTab->aCol[iCol];
            pCol->colFlags |= COLFLAG_PRIMKEY;
            break;
          }
        }
      }
    }
  }
  if( nTerm==1
   && pCol
   && sqlite3StrICmp(sqlite3ColumnType(pCol,""), "INTEGER")==0
   && sortOrder!=SQLITE_SO_DESC
  ){
    if( IN_RENAME_OBJECT && pList ){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[0].pExpr);
      sqlite3RenameTokenRemap(pParse, &pTab->iPKey, pCExpr);
    }
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
    if( pList ) pParse->iPkSortOrder = pList->a[0].sortOrder;
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0,
                           0, sortOrder, 0, SQLITE_IDXTYPE_PRIMARYKEY);
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}